

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disk_interface_test.cc
# Opt level: O0

Test * anon_unknown.dwarf_57051::DiskInterfaceTestStatExistingFile::Create(void)

{
  Test *this;
  
  this = (Test *)operator_new(0x58);
  DiskInterfaceTestStatExistingFile((DiskInterfaceTestStatExistingFile *)this);
  g_current_test = this;
  return this;
}

Assistant:

TEST_F(DiskInterfaceTest, StatExistingFile) {
  string err;
  ASSERT_TRUE(Touch("file"));
  EXPECT_GT(disk_.Stat("file", &err), 1);
  EXPECT_EQ("", err);
}